

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::internal::check_sign<char>(char **s,Arg *arg)

{
  FormatError *this;
  char sign;
  string local_38;
  
  sign = **s;
  require_numeric_argument(arg,sign);
  if ((arg->type != ULONG_LONG) && (arg->type != UINT)) {
    *s = *s + 1;
    return;
  }
  this = (FormatError *)__cxa_allocate_exception(0x10);
  format<char>(&local_38,(CStringRef)0x148bb4,&sign);
  FormatError::FormatError(this,(CStringRef)local_38._M_dataplus._M_p);
  __cxa_throw(this,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

void check_sign(const Char *&s, const Arg &arg) {
  char sign = static_cast<char>(*s);
  require_numeric_argument(arg, sign);
  if (arg.type == Arg::UINT || arg.type == Arg::ULONG_LONG) {
    FMT_THROW(FormatError(fmt::format(
      "format specifier '{}' requires signed argument", sign)));
  }
  ++s;
}